

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O1

Matrix<Complex> __thiscall Matrix<Complex>::transposed(Matrix<Complex> *this)

{
  long lVar1;
  Complex *extraout_RDX;
  long lVar2;
  uint *in_RSI;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  Complex *this_00;
  Matrix<Complex> MVar6;
  Complex *local_48;
  
  Matrix(this,in_RSI[1],*in_RSI);
  local_48 = extraout_RDX;
  if (*in_RSI != 0) {
    local_48 = (Complex *)0x0;
    do {
      uVar5 = (ulong)in_RSI[1];
      if (in_RSI[1] != 0) {
        lVar2 = 0x40;
        uVar4 = 0;
        do {
          lVar1 = *(long *)(in_RSI + 2);
          uVar5 = (ulong)(uint)((int)uVar5 * (int)local_48);
          this_00 = this->arr +
                    (long)&(local_48->_re)._numerator.digits.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start + (ulong)(this->N * (int)uVar4);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     (uVar5 * 0x80 + lVar1 + lVar2 + -0x40));
          lVar3 = uVar5 * 0x80 + lVar1 + lVar2;
          (this_00->_re)._numerator.negative = *(bool *)(lVar3 + -0x28);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                    (&(this_00->_re)._denominator.digits,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(lVar3 + -0x20));
          lVar3 = uVar5 * 0x80 + lVar1;
          (this_00->_re)._denominator.negative = *(bool *)(lVar2 + -8 + lVar3);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&this_00->_im,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(lVar3 + lVar2));
          lVar3 = uVar5 * 0x80 + lVar1 + lVar2;
          (this_00->_im)._numerator.negative = *(bool *)(lVar3 + 0x18);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                    (&(this_00->_im)._denominator.digits,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(lVar3 + 0x20));
          (this_00->_im)._denominator.negative = *(bool *)(lVar2 + 0x38 + lVar1 + uVar5 * 0x80);
          uVar4 = uVar4 + 1;
          uVar5 = (ulong)in_RSI[1];
          lVar2 = lVar2 + 0x80;
        } while (uVar4 < uVar5);
      }
      local_48 = (Complex *)
                 ((long)&(local_48->_re)._numerator.digits.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start + 1);
    } while (local_48 < (Complex *)(ulong)*in_RSI);
  }
  MVar6.arr = local_48;
  MVar6._0_8_ = this;
  return MVar6;
}

Assistant:

const Matrix<Field> Matrix<Field>::transposed() const
{
    Matrix res(N, M);
    for(unsigned i = 0; i < M; ++i)
        for(unsigned j = 0; j < N; ++j)
        {
            res[j][i] = (*this)[i][j];
        }
    return res;
}